

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,vector3f *value)

{
  bool bVar1;
  float3 v;
  array<float,_3UL> local_14;
  
  bVar1 = ParseBasicTypeTuple<float,3ul>(this,&local_14);
  if (bVar1) {
    value->x = local_14._M_elems[0];
    value->y = local_14._M_elems[1];
    value->z = local_14._M_elems[2];
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::vector3f *value) {
  value::float3 v;
  if (ParseBasicTypeTuple(&v)) {
    value->x = v[0];
    value->y = v[1];
    value->z = v[2];
    return true;
  }
  return false;
}